

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

void my_emit_message(j_common_ptr cinfo,int msg_level)

{
  long lVar1;
  int in_ESI;
  long *in_RDI;
  my_error_ptr myerr;
  
  lVar1 = *in_RDI;
  (**(code **)(lVar1 + 0x170))(in_RDI,in_ESI);
  if ((in_ESI < 0) && (*(undefined4 *)(lVar1 + 0x178) = 1, *(int *)(lVar1 + 0x17c) != 0)) {
    longjmp((__jmp_buf_tag *)(lVar1 + 0xa8),1);
  }
  return;
}

Assistant:

static void my_emit_message(j_common_ptr cinfo, int msg_level)
{
  my_error_ptr myerr = (my_error_ptr)cinfo->err;

  myerr->emit_message(cinfo, msg_level);
  if (msg_level < 0) {
    myerr->warning = TRUE;
    if (myerr->stopOnWarning) longjmp(myerr->setjmp_buffer, 1);
  }
}